

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::ReLU_x86_avx2::forward_inplace(ReLU_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 (*pauVar13) [32];
  undefined1 (*pauVar14) [16];
  float *pfVar15;
  Mat *in_RSI;
  long *in_RDI;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int remain_1;
  float *ptr_5;
  int q_5;
  int remain;
  float *ptr_4;
  int q_4;
  __m128 _p_3;
  int i_3;
  float *ptr_3;
  int q_3;
  __m128 _p_2;
  int i_2;
  __m128 _zero_1;
  float *ptr_2;
  int q_2;
  __m256 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  __m256 _zero;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int d;
  int h;
  int w;
  int elembits;
  __m256 neg;
  __m256 pos;
  __m128 neg_1;
  __m128 pos_1;
  undefined8 in_stack_fffffffffffff748;
  Mat *this_00;
  Mat *in_stack_fffffffffffff750;
  int local_85c;
  Mat local_858;
  float *local_810;
  int local_804;
  float local_800;
  int local_7fc;
  Option *in_stack_fffffffffffff820;
  Mat *in_stack_fffffffffffff828;
  ReLU_x86_avx2 *in_stack_fffffffffffff830;
  float *local_7b0;
  int local_7a4;
  int local_78c;
  Mat local_788;
  Mat *local_740;
  int local_734;
  undefined8 local_730;
  undefined8 uStack_728;
  int local_714;
  undefined8 local_710;
  undefined8 uStack_708;
  Mat local_6f8;
  undefined1 (*local_6b0) [16];
  int local_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  int local_67c;
  Mat local_678;
  undefined1 (*local_630) [32];
  int local_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  int local_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  Mat local_5a0;
  undefined1 (*local_558) [32];
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  int local_540;
  int local_53c;
  int local_538;
  int local_534;
  Mat *local_528;
  int local_518;
  undefined4 local_514;
  undefined1 (*local_510) [32];
  undefined1 (*local_508) [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 (*local_4c8) [32];
  undefined1 local_4c0 [32];
  undefined1 (*local_488) [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  uint local_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  uint local_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined4 local_334;
  Mat *local_330;
  undefined1 (*local_328) [16];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  Mat *local_308;
  undefined1 local_300 [16];
  undefined1 (*local_2e8) [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  float local_294;
  void *local_290;
  int *piStack_288;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float local_264;
  void *local_260;
  int *piStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  uint local_220;
  uint local_21c;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  uint local_208;
  uint local_204;
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  void *local_90;
  int *piStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 local_60 [8];
  float fStack_58;
  float fStack_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_528 = in_RSI;
  local_534 = ncnn::Mat::elembits(in_RSI);
  if (local_534 == 8) {
    local_518 = forward_inplace_int8
                          (in_stack_fffffffffffff830,in_stack_fffffffffffff828,
                           in_stack_fffffffffffff820);
  }
  else {
    local_538 = local_528->w;
    local_53c = local_528->h;
    local_540 = local_528->d;
    local_544 = local_528->c;
    local_548 = local_538 * local_53c * local_540;
    local_54c = local_528->elempack;
    if (local_54c == 8) {
      fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        local_54c = 8;
        for (local_624 = 0; local_624 < local_544; local_624 = local_624 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff750,
                             (int)((ulong)in_stack_fffffffffffff748 >> 0x20));
          pauVar13 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_678);
          ncnn::Mat::~Mat((Mat *)0x4ed2e2);
          local_630 = pauVar13;
          for (local_67c = 0; local_67c < local_548; local_67c = local_67c + 1) {
            local_510 = local_630;
            local_6a0 = *(undefined8 *)*local_630;
            uStack_698 = *(undefined8 *)(*local_630 + 8);
            uStack_690 = *(undefined8 *)(*local_630 + 0x10);
            uStack_688 = *(undefined8 *)(*local_630 + 0x18);
            local_4c8 = local_630;
            local_3e4 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_1c0 = ZEXT1232(ZEXT812(0));
            local_380 = 0;
            uStack_378 = 0;
            uStack_370 = 0;
            uStack_368 = 0;
            local_420 = vmaxps_avx(ZEXT832(0),*local_630);
            local_160 = 0;
            uStack_158 = 0;
            uStack_150 = 0;
            uStack_148 = 0;
            local_440 = vminps_avx(ZEXT832(0),*local_630);
            auVar2 = vinsertps_avx(ZEXT416(local_3e4),ZEXT416(local_3e4),0x10);
            auVar2 = vinsertps_avx(auVar2,ZEXT416(local_3e4),0x20);
            auVar2 = vinsertps_avx(auVar2,ZEXT416(local_3e4),0x30);
            auVar3 = vinsertps_avx(ZEXT416(local_3e4),ZEXT416(local_3e4),0x10);
            auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3e4),0x20);
            auVar3 = vinsertps_avx(auVar3,ZEXT416(local_3e4),0x30);
            auVar17._16_16_ = auVar2;
            auVar17._0_16_ = auVar3;
            local_240._0_8_ = auVar3._0_8_;
            uVar4 = local_240._0_8_;
            local_240._8_8_ = auVar3._8_8_;
            uVar5 = local_240._8_8_;
            local_240._16_8_ = auVar2._0_8_;
            uVar6 = local_240._16_8_;
            local_240._24_8_ = auVar2._8_8_;
            uVar7 = local_240._24_8_;
            local_e0._0_4_ = auVar3._0_4_;
            local_e0._4_4_ = auVar3._4_4_;
            uStack_d8._0_4_ = auVar3._8_4_;
            uStack_d8._4_4_ = auVar3._12_4_;
            uStack_d0._0_4_ = auVar2._0_4_;
            uStack_d0._4_4_ = auVar2._4_4_;
            uStack_c8._0_4_ = auVar2._8_4_;
            uStack_c8._4_4_ = auVar2._12_4_;
            fStack_124 = uStack_c8._4_4_;
            local_100._0_4_ = local_440._0_4_;
            local_100._4_4_ = local_440._4_4_;
            uStack_f8._0_4_ = local_440._8_4_;
            uStack_f8._4_4_ = local_440._12_4_;
            uStack_f0._0_4_ = local_440._16_4_;
            uStack_f0._4_4_ = local_440._20_4_;
            uStack_e8._0_4_ = local_440._24_4_;
            local_140 = (float)local_e0 * (float)local_100;
            fStack_13c = local_e0._4_4_ * local_100._4_4_;
            fStack_138 = (float)uStack_d8 * (float)uStack_f8;
            fStack_134 = uStack_d8._4_4_ * uStack_f8._4_4_;
            fStack_130 = (float)uStack_d0 * (float)uStack_f0;
            fStack_12c = uStack_d0._4_4_ * uStack_f0._4_4_;
            fStack_128 = (float)uStack_c8 * (float)uStack_e8;
            local_120._0_4_ = local_420._0_4_;
            local_120._4_4_ = local_420._4_4_;
            uStack_118._0_4_ = local_420._8_4_;
            uStack_118._4_4_ = local_420._12_4_;
            uStack_110._0_4_ = local_420._16_4_;
            uStack_110._4_4_ = local_420._20_4_;
            uStack_108._0_4_ = local_420._24_4_;
            uStack_108._4_4_ = local_420._28_4_;
            local_500 = (float)local_120 + local_140;
            fStack_4fc = local_120._4_4_ + fStack_13c;
            fStack_4f8 = (float)uStack_118 + fStack_138;
            fStack_4f4 = uStack_118._4_4_ + fStack_134;
            fStack_4f0 = (float)uStack_110 + fStack_130;
            fStack_4ec = uStack_110._4_4_ + fStack_12c;
            fStack_4e8 = (float)uStack_108 + fStack_128;
            fStack_4e4 = uStack_108._4_4_ + uStack_c8._4_4_;
            auVar8._4_4_ = fStack_4fc;
            auVar8._0_4_ = local_500;
            auVar8._8_4_ = fStack_4f8;
            auVar8._12_4_ = fStack_4f4;
            auVar8._16_4_ = fStack_4f0;
            auVar8._20_4_ = fStack_4ec;
            auVar8._24_4_ = fStack_4e8;
            auVar8._28_4_ = fStack_4e4;
            *local_630 = auVar8;
            local_630 = local_630 + 1;
            local_3e0 = local_6a0;
            uStack_3d8 = uStack_698;
            uStack_3d0 = uStack_690;
            uStack_3c8 = uStack_688;
            local_3a4 = local_3e4;
            local_3a0 = local_6a0;
            uStack_398 = uStack_698;
            uStack_390 = uStack_690;
            uStack_388 = uStack_688;
            local_240 = auVar17;
            local_220 = local_3e4;
            local_21c = local_3e4;
            local_218 = local_3e4;
            local_214 = local_3e4;
            local_210 = local_3e4;
            local_20c = local_3e4;
            local_208 = local_3e4;
            local_204 = local_3e4;
            local_1a0 = local_1c0;
            local_180 = local_6a0;
            uStack_178 = uStack_698;
            uStack_170 = uStack_690;
            uStack_168 = uStack_688;
            local_120 = local_420._0_8_;
            uStack_118 = local_420._8_8_;
            uStack_110 = local_420._16_8_;
            uStack_108 = local_420._24_8_;
            local_100 = local_440._0_8_;
            uStack_f8 = local_440._8_8_;
            uStack_f0 = local_440._16_8_;
            uStack_e8 = local_440._24_8_;
            local_e0 = uVar4;
            uStack_d8 = uVar5;
            uStack_d0 = uVar6;
            uStack_c8 = uVar7;
          }
        }
      }
      else {
        local_54c = 8;
        for (local_550 = 0; local_550 < local_544; local_550 = local_550 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff750,
                             (int)((ulong)in_stack_fffffffffffff748 >> 0x20));
          pauVar13 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_5a0);
          ncnn::Mat::~Mat((Mat *)0x4ed068);
          local_514 = 0;
          local_1c4 = 0;
          local_1c8 = 0;
          local_1cc = 0;
          local_1d0 = 0;
          local_1d4 = 0;
          local_1d8 = 0;
          local_1dc = 0;
          local_1e0 = 0;
          auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
          auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
          auVar16._16_16_ = auVar2;
          auVar16._0_16_ = auVar3;
          local_200._0_8_ = auVar3._0_8_;
          local_200._8_8_ = auVar3._8_8_;
          local_200._16_8_ = auVar2._0_8_;
          local_200._24_8_ = auVar2._8_8_;
          local_5e0 = local_200._0_8_;
          uStack_5d8 = local_200._8_8_;
          uStack_5d0 = local_200._16_8_;
          uStack_5c8 = local_200._24_8_;
          local_558 = pauVar13;
          for (local_5e4 = 0; local_5e4 < local_548; local_5e4 = local_5e4 + 1) {
            local_508 = local_558;
            local_620 = *(undefined8 *)*local_558;
            uStack_618 = *(undefined8 *)(*local_558 + 8);
            uStack_610 = *(undefined8 *)(*local_558 + 0x10);
            uStack_608 = *(undefined8 *)(*local_558 + 0x18);
            local_488 = local_558;
            local_460 = local_200._0_8_;
            uStack_458 = local_200._8_8_;
            uStack_450 = local_200._16_8_;
            uStack_448 = local_200._24_8_;
            auVar9._16_8_ = local_200._16_8_;
            auVar9._0_16_ = auVar3;
            auVar9._24_8_ = local_200._24_8_;
            local_4c0 = vmaxps_avx(auVar9,*local_558);
            *(undefined8 *)*local_558 = local_4c0._0_8_;
            *(undefined8 *)(*local_558 + 8) = local_4c0._8_8_;
            *(undefined8 *)(*local_558 + 0x10) = local_4c0._16_8_;
            *(undefined8 *)(*local_558 + 0x18) = local_4c0._24_8_;
            local_558 = local_558 + 1;
            local_480 = local_620;
            uStack_478 = uStack_618;
            uStack_470 = uStack_610;
            uStack_468 = uStack_608;
          }
          local_200 = auVar16;
        }
      }
      local_518 = 0;
    }
    else if (local_54c == 4) {
      fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        local_54c = 4;
        for (local_734 = 0; local_734 < local_544; local_734 = local_734 + 1) {
          this_00 = &local_788;
          ncnn::Mat::channel(in_stack_fffffffffffff750,(int)((ulong)this_00 >> 0x20));
          in_stack_fffffffffffff750 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
          ncnn::Mat::~Mat((Mat *)0x4ed83b);
          local_740 = in_stack_fffffffffffff750;
          for (local_78c = 0; local_78c < local_548; local_78c = local_78c + 1) {
            local_330 = local_740;
            local_290 = local_740->data;
            piStack_288 = local_740->refcount;
            auVar12._0_8_ = local_740->data;
            auVar12._8_8_ = local_740->refcount;
            auVar3._0_8_ = local_740->data;
            auVar3._8_8_ = local_740->refcount;
            local_308 = local_740;
            local_294 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_b0._0_12_ = ZEXT812(0);
            local_b0._12_4_ = 0;
            local_250 = 0;
            uStack_248 = 0;
            local_2b0 = vmaxps_avx(ZEXT816(0),auVar3);
            local_80 = 0;
            uStack_78 = 0;
            local_2c0 = vminps_avx(ZEXT816(0),auVar12);
            local_40 = CONCAT44(local_294,local_294);
            uStack_38 = CONCAT44(local_294,local_294);
            local_50._0_4_ = local_2c0._0_4_;
            local_50._4_4_ = local_2c0._4_4_;
            uStack_48._0_4_ = local_2c0._8_4_;
            uStack_48._4_4_ = local_2c0._12_4_;
            local_70 = local_294 * (float)local_50;
            fStack_6c = local_294 * local_50._4_4_;
            fStack_68 = local_294 * (float)uStack_48;
            fStack_64 = local_294 * uStack_48._4_4_;
            local_60._0_4_ = local_2b0._0_4_;
            local_60._4_4_ = local_2b0._4_4_;
            fStack_58 = local_2b0._8_4_;
            fStack_54 = local_2b0._12_4_;
            local_320 = (float)local_60._0_4_ + local_70;
            fStack_31c = (float)local_60._4_4_ + fStack_6c;
            fStack_318 = fStack_58 + fStack_68;
            fStack_314 = fStack_54 + fStack_64;
            uVar11 = fStack_31c;
            uVar10 = local_320;
            auVar2._0_8_ = CONCAT44(uVar11,uVar10);
            auVar2._8_4_ = fStack_318;
            auVar2._12_4_ = fStack_314;
            local_330->data = (void *)auVar2._0_8_;
            local_330->refcount = (int *)auVar2._8_8_;
            local_740 = (Mat *)&local_740->elemsize;
            local_280 = local_294;
            fStack_27c = local_294;
            fStack_278 = local_294;
            fStack_274 = local_294;
            local_264 = local_294;
            local_260 = local_290;
            piStack_258 = piStack_288;
            local_a0 = local_b0;
            local_90 = local_290;
            piStack_88 = piStack_288;
            _local_60 = local_2b0;
            local_50 = local_2c0._0_8_;
            uStack_48 = local_2c0._8_8_;
          }
        }
      }
      else {
        local_54c = 4;
        for (local_6a4 = 0; local_6a4 < local_544; local_6a4 = local_6a4 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff750,
                             (int)((ulong)in_stack_fffffffffffff748 >> 0x20));
          pauVar14 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_6f8);
          ncnn::Mat::~Mat((Mat *)0x4ed687);
          local_334 = 0;
          local_350 = 0;
          uStack_34c = 0;
          uStack_348 = 0;
          uStack_344 = 0;
          local_710 = 0;
          uStack_708 = 0;
          local_6b0 = pauVar14;
          for (local_714 = 0; local_714 < local_548; local_714 = local_714 + 1) {
            local_328 = local_6b0;
            local_730 = *(undefined8 *)*local_6b0;
            uStack_728 = *(undefined8 *)(*local_6b0 + 8);
            local_2e8 = local_6b0;
            local_300 = vmaxps_avx(ZEXT816(0),*local_6b0);
            *(undefined8 *)*local_6b0 = local_300._0_8_;
            *(undefined8 *)(*local_6b0 + 8) = local_300._8_8_;
            local_6b0 = local_6b0 + 1;
            local_2e0 = local_730;
            uStack_2d8 = uStack_728;
            local_2d0 = local_710;
            uStack_2c8 = uStack_708;
          }
        }
      }
      local_518 = 0;
    }
    else {
      fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        for (local_804 = 0; local_804 < local_544; local_804 = local_804 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff750,
                             (int)((ulong)in_stack_fffffffffffff748 >> 0x20));
          pfVar15 = ncnn::Mat::operator_cast_to_float_(&local_858);
          ncnn::Mat::~Mat((Mat *)0x4edc2e);
          local_810 = pfVar15;
          for (local_85c = local_548; 0 < local_85c; local_85c = local_85c + -1) {
            if (*local_810 < 0.0) {
              *local_810 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * *local_810
              ;
            }
            local_810 = local_810 + 1;
          }
        }
      }
      else {
        for (local_7a4 = 0; local_7a4 < local_544; local_7a4 = local_7a4 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff750,
                             (int)((ulong)in_stack_fffffffffffff748 >> 0x20));
          local_7b0 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffff808);
          ncnn::Mat::~Mat((Mat *)0x4edb0f);
          for (local_7fc = local_548; 0 < local_7fc; local_7fc = local_7fc + -1) {
            local_800 = 0.0;
            pfVar15 = std::max<float>(local_7b0,&local_800);
            *local_7b0 = *pfVar15;
            local_7b0 = local_7b0 + 1;
          }
        }
      }
      local_518 = 0;
    }
  }
  return local_518;
}

Assistant:

int ReLU_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _zero = _mm256_set1_ps(0.f);
                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_max_ps(_zero, _p));
                    ptr += 8;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, lrelu_avx(_p, slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _zero = _mm_set1_ps(0.f);
                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_max_ps(_zero, _p));
                    ptr += 4;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, lrelu_sse(_p, slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *ptr = std::max(*ptr, 0.f);

                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                if (*ptr < 0)
                    *ptr *= slope;

                ptr++;
            }
        }
    }

    return 0;
}